

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

mbedtls_md_info_t * mbedtls_md_info_from_string(char *md_name)

{
  int iVar1;
  bool bVar2;
  md_name_entry *local_20;
  md_name_entry *entry;
  char *md_name_local;
  
  if (md_name == (char *)0x0) {
    md_name_local = (char *)0x0;
  }
  else {
    local_20 = md_names;
    while( true ) {
      bVar2 = false;
      if (local_20->md_name != (char *)0x0) {
        iVar1 = strcmp(local_20->md_name,md_name);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      local_20 = local_20 + 1;
    }
    md_name_local = (char *)mbedtls_md_info_from_type(local_20->md_type);
  }
  return (mbedtls_md_info_t *)md_name_local;
}

Assistant:

const mbedtls_md_info_t *mbedtls_md_info_from_string(const char *md_name)
{
    if (NULL == md_name) {
        return NULL;
    }

    const md_name_entry *entry = md_names;
    while (entry->md_name != NULL &&
           strcmp(entry->md_name, md_name) != 0) {
        ++entry;
    }

    return mbedtls_md_info_from_type(entry->md_type);
}